

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O2

lzma_ret lzma_index_encoder_init
                   (lzma_next_coder_conflict12 *next,lzma_allocator *allocator,lzma_index *i)

{
  lzma_ret lVar1;
  lzma_coder_conflict13 *coder;
  
  if ((code *)next->init != lzma_index_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_index_encoder_init;
  if (i == (lzma_index *)0x0) {
    lVar1 = LZMA_PROG_ERROR;
  }
  else {
    coder = next->coder;
    if (coder == (lzma_coder_conflict13 *)0x0) {
      coder = (lzma_coder_conflict13 *)lzma_alloc(0x150,allocator);
      next->coder = coder;
      if (coder == (lzma_coder_conflict13 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = index_encode;
      next->end = index_encoder_end;
    }
    index_encoder_reset(coder,i);
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_index_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_index *i)
{
	lzma_next_coder_init(&lzma_index_encoder_init, next, allocator);

	if (i == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &index_encode;
		next->end = &index_encoder_end;
	}

	index_encoder_reset(next->coder, i);

	return LZMA_OK;
}